

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O2

void __thiscall DEnterKey::SetMenuMessage(DEnterKey *this,int which)

{
  bool bVar1;
  DMenu *this_00;
  DOptionMenu *this_01;
  FOptionMenuItem *pFVar2;
  TObjPtr<DMenu> *obj;
  FName local_14;
  
  obj = &(this->super_DMenu).mParentMenu;
  this_00 = GC::ReadBarrier<DMenu>((DMenu **)obj);
  bVar1 = DObject::IsKindOf(&this_00->super_DObject,DOptionMenu::RegistrationInfo.MyClass);
  if (bVar1) {
    this_01 = (DOptionMenu *)GC::ReadBarrier<DMenu>((DMenu **)obj);
    pFVar2 = DOptionMenu::GetItem(this_01,&local_14);
    if (pFVar2 != (FOptionMenuItem *)0x0) {
      (*(pFVar2->super_FListMenuItem)._vptr_FListMenuItem[10])(pFVar2,0,which);
    }
  }
  return;
}

Assistant:

void SetMenuMessage(int which)
	{
		if (mParentMenu->IsKindOf(RUNTIME_CLASS(DOptionMenu)))
		{
			DOptionMenu *m = barrier_cast<DOptionMenu*>(mParentMenu);
			FListMenuItem *it = m->GetItem(NAME_Controlmessage);
			if (it != NULL)
			{
				it->SetValue(0, which);
			}
		}
	}